

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
          *per_pixel_fn)

{
  function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *this_00;
  uint64_t local_80;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  int xx;
  int yy;
  ssize_t h_local;
  ssize_t w_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *source_local;
  Image *this_local;
  
  this_00 = per_pixel_fn;
  _xx = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (ssize_t)source;
  source_local = this;
  if (w < 0) {
    h_local = get_width(source);
  }
  if ((long)_xx < 0) {
    _xx = get_height((Image *)x_local);
  }
  clamp_blit_dimensions(this,(Image *)x_local,&y_local,&w_local,&h_local,(ssize_t *)&xx,&sx,&sy);
  for (sr._4_4_ = 0; (long)sr._4_4_ < (long)_xx; sr._4_4_ = sr._4_4_ + 1) {
    for (sr._0_4_ = 0; (int)sr < h_local; sr._0_4_ = (int)sr + 1) {
      read_pixel((Image *)x_local,sx + (int)sr,sy + sr._4_4_,&sg,&sb,&sa,&dr);
      read_pixel(this,y_local + (int)sr,w_local + sr._4_4_,&dg,&db,&da,&local_80);
      ::std::
      function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
      ::operator()(this_00,&dg,&db,&da,&local_80,sg,sb,sa,dr);
      write_pixel(this,y_local + (int)sr,w_local + sr._4_4_,dg,db,da,local_80);
    }
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint64_t&, uint64_t&, uint64_t&, uint64_t&, uint64_t, uint64_t, uint64_t, uint64_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa, dr, dg, db, da;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);

      per_pixel_fn(dr, dg, db, da, sr, sg, sb, sa);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}